

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O0

UnknownField * __thiscall google::protobuf::UnknownFieldSet::field(UnknownFieldSet *this,int index)

{
  LogMessage *other;
  reference pvVar1;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  UnknownFieldSet *pUStack_10;
  int index_local;
  UnknownFieldSet *this_local;
  
  local_51 = 0;
  local_14 = index;
  pUStack_10 = this;
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
               ,0x11c);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: fields_ != NULL: ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = std::
           vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
           operator[](this->fields_,(long)local_14);
  return pvVar1;
}

Assistant:

inline const UnknownField& UnknownFieldSet::field(int index) const {
  GOOGLE_DCHECK(fields_ != NULL);
  return (*fields_)[index];
}